

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O2

int __thiscall QXmlStreamReaderPrivate::init(QXmlStreamReaderPrivate *this,EVP_PKEY_CTX *ctx)

{
  int *piVar1;
  long in_FS_OFFSET;
  QStringConverter local_68;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this->scanDtd = false;
  this->lastAttributeIsCData = false;
  this->token = -1;
  this->token_char = 0;
  *(ushort *)&this->field_0x3a8 = (ushort)*(undefined4 *)&this->field_0x3a8 & 0xdff0 | 2;
  this->resumeReduction = 0;
  this->tos = 1;
  piVar1 = this->state_stack;
  *piVar1 = 0;
  piVar1[this->tos] = 0;
  (this->putStack).tos = -1;
  QXmlStreamSimpleStack<unsigned_int>::reserve(&this->putStack,0x20);
  QString::clear(&this->textBuffer);
  QString::reserve(&this->textBuffer,0x100);
  (this->super_QXmlStreamPrivateTagStack).tagStack.tos = -1;
  (this->super_QXmlStreamPrivateTagStack).tagsDone = false;
  QList<QXmlStreamAttribute>::clear(&(this->attributes).super_QList<QXmlStreamAttribute>);
  QList<QXmlStreamAttribute>::reserve(&(this->attributes).super_QList<QXmlStreamAttribute>,0x10);
  this->readBufferPos = 0;
  this->nbytesread = 0;
  this->lineNumber = 0;
  this->lastLineStart = 0;
  this->characterOffset = 0;
  local_68.state.field_4.d[0] = (void *)0x0;
  local_68.state.field_4.d[1] = (void *)0x0;
  local_68.state.remainingChars = 0;
  local_68.state.invalidChars = 0;
  local_68.iface = (Interface *)0x0;
  local_68.state.flags.super_QFlagsStorageHelper<QStringConverterBase::Flag,_4>.
  super_QFlagsStorage<QStringConverterBase::Flag>.i =
       (QFlagsStorageHelper<QStringConverterBase::Flag,_4>)0x0;
  local_68.state.internalState = 0;
  local_68.state.clearFn = (ClearDataFn)0x0;
  QStringConverter::operator=(&(this->decoder).super_QStringConverter,&local_68);
  QStringConverterBase::State::clear(&local_68.state);
  (this->attributeStack).tos = -1;
  QXmlStreamSimpleStack<QXmlStreamReaderPrivate::Attribute>::reserve(&this->attributeStack,0x10);
  std::__uniq_ptr_impl<QXmlStreamReaderPrivate,_std::default_delete<QXmlStreamReaderPrivate>_>::
  reset((__uniq_ptr_impl<QXmlStreamReaderPrivate,_std::default_delete<QXmlStreamReaderPrivate>_> *)
        &this->entityParser,(pointer)0x0);
  this->atEnd = false;
  *(ushort *)&this->field_0x3a8 = (ushort)*(undefined4 *)&this->field_0x3a8 & 0xe00f | 0x1000;
  QByteArray::clear(&this->rawReadBuffer);
  QByteArray::clear(&this->dataBuffer);
  QString::clear(&this->readBuffer);
  (this->super_QXmlStreamPrivateTagStack).tagStackStringStorageSize =
       (this->super_QXmlStreamPrivateTagStack).initialTagStackStringStorageSize;
  this->type = NoToken;
  this->error = NoError;
  this->currentContext = Prolog;
  this->foundDTD = false;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QXmlStreamReaderPrivate::init()
{
    scanDtd = false;
    lastAttributeIsCData = false;
    token = -1;
    token_char = 0;
    isEmptyElement = false;
    isWhitespace = true;
    isCDATA = false;
    standalone = false;
    hasStandalone = false;
    tos = 0;
    resumeReduction = 0;
    state_stack[tos++] = 0;
    state_stack[tos] = 0;
    putStack.clear();
    putStack.reserve(32);
    textBuffer.clear();
    textBuffer.reserve(256);
    tagStack.clear();
    tagsDone = false;
    attributes.clear();
    attributes.reserve(16);
    lineNumber = lastLineStart = characterOffset = 0;
    readBufferPos = 0;
    nbytesread = 0;
    decoder = QStringDecoder();
    attributeStack.clear();
    attributeStack.reserve(16);
    entityParser.reset();
    hasCheckedStartDocument = false;
    normalizeLiterals = false;
    hasSeenTag = false;
    atEnd = false;
    inParseEntity = false;
    referenceToUnparsedEntityDetected = false;
    referenceToParameterEntityDetected = false;
    hasExternalDtdSubset = false;
    lockEncoding = false;
    namespaceProcessing = true;
    rawReadBuffer.clear();
    dataBuffer.clear();
    readBuffer.clear();
    tagStackStringStorageSize = initialTagStackStringStorageSize;

    type = QXmlStreamReader::NoToken;
    error = QXmlStreamReader::NoError;
    currentContext = XmlContext::Prolog;
    foundDTD = false;
}